

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall BuildWithDepsLogTestStraightforward::Run(BuildWithDepsLogTestStraightforward *this)

{
  BuildConfig *config;
  FakeCommandRunner *pFVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  Test *pTVar5;
  _Head_base<0UL,_CommandRunner_*,_false> _Var6;
  bool bVar7;
  bool condition;
  int iVar8;
  int iVar9;
  LoadStatus LVar10;
  Node *pNVar11;
  TimeStamp TVar12;
  string err;
  DepsLog deps_log;
  Builder builder;
  State state;
  string local_2e8;
  VirtualFileSystem *local_2c8;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  pointer local_250;
  pointer ppNStack_248;
  pointer local_240;
  pointer ppDStack_238;
  pointer local_230;
  pointer ppDStack_228;
  FakeCommandRunner *local_220;
  BuildConfig *local_218;
  undefined1 local_210 [128];
  _Head_base<0UL,_CommandRunner_*,_false> local_190;
  State local_138;
  
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  State::State(&local_138);
  iVar8 = g_current_test->assertion_failures_;
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&local_138);
  iVar9 = g_current_test->assertion_failures_;
  if (iVar8 == iVar9) {
    AssertParse(&local_138,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                (ManifestParserOptions)0x0);
    pTVar5 = g_current_test;
    iVar9 = g_current_test->assertion_failures_;
    if (iVar8 != iVar9) goto LAB_0013060b;
    local_280._0_8_ = local_280._0_8_ & 0xffffffffffffff00;
    local_280._8_8_ = (FILE *)0x0;
    local_280._24_8_ = 0;
    local_260._M_local_buf[0] = '\0';
    local_250 = (pointer)0x0;
    ppNStack_248 = (pointer)0x0;
    local_240 = (pointer)0x0;
    ppDStack_238 = (pointer)0x0;
    local_230 = (pointer)0x0;
    ppDStack_228 = (pointer)0x0;
    local_210._0_8_ = local_210 + 0x10;
    local_280._16_8_ = &local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"ninja_deps","");
    bVar7 = DepsLog::OpenForWrite((DepsLog *)local_280,(string *)local_210,&local_2c0);
    bVar7 = testing::Test::Check
                      (pTVar5,bVar7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x849,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    pTVar5 = g_current_test;
    if (!bVar7) {
LAB_001306c1:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      DepsLog::~DepsLog((DepsLog *)local_280);
      goto LAB_00130614;
    }
    iVar8 = std::__cxx11::string::compare((char *)&local_2c0);
    bVar7 = testing::Test::Check
                      (pTVar5,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x84a,"\"\" == err");
    if (!bVar7) goto LAB_001306c1;
    config = &(this->super_BuildWithDepsLogTest).super_BuildTest.config_;
    local_2c8 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
    Builder::Builder((Builder *)local_210,&local_138,config,(BuildLog *)0x0,(DepsLog *)local_280,
                     &local_2c8->super_DiskInterface);
    pFVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_;
    _Var6._M_head_impl = &pFVar1->super_CommandRunner;
    if (local_190._M_head_impl != (CommandRunner *)0x0) {
      lVar4 = *(long *)local_190._M_head_impl;
      local_190._M_head_impl = &pFVar1->super_CommandRunner;
      (**(code **)(lVar4 + 8))();
      _Var6._M_head_impl = local_190._M_head_impl;
    }
    local_190._M_head_impl = _Var6._M_head_impl;
    pTVar5 = g_current_test;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"out","");
    pNVar11 = Builder::AddTarget((Builder *)local_210,&local_2e8,&local_2c0);
    testing::Test::Check
              (pTVar5,pNVar11 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x84e,"builder.AddTarget(\"out\", &err)");
    local_220 = pFVar1;
    local_218 = config;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    pTVar5 = g_current_test;
    iVar8 = std::__cxx11::string::compare((char *)&local_2c0);
    bVar7 = testing::Test::Check
                      (pTVar5,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x84f,"\"\" == err");
    if (bVar7) {
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"in1.d","");
      paVar3 = &local_2a0.field_2;
      local_2a0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"out: in2","");
      VirtualFileSystem::Create(local_2c8,&local_2e8,&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar3) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      pTVar5 = g_current_test;
      condition = Builder::Build((Builder *)local_210,&local_2c0);
      testing::Test::Check
                (pTVar5,condition,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x851,"builder.Build(&err)");
      pTVar5 = g_current_test;
      iVar8 = std::__cxx11::string::compare((char *)&local_2c0);
      testing::Test::Check
                (pTVar5,iVar8 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x852,"\"\" == err");
      pTVar5 = g_current_test;
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"in1.d","");
      TVar12 = VirtualFileSystem::Stat(local_2c8,&local_2e8,&local_2c0);
      testing::Test::Check
                (pTVar5,TVar12 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x855,"0 == fs_.Stat(\"in1.d\", &err)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"in1.d","");
      local_2a0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"out: in2","");
      VirtualFileSystem::Create(local_2c8,&local_2e8,&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar3) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      DepsLog::Close((DepsLog *)local_280);
      local_190._M_head_impl = (CommandRunner *)0x0;
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    Builder::~Builder((Builder *)local_210);
    DepsLog::~DepsLog((DepsLog *)local_280);
    if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d6ce0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
    ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
    if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
    ::~_Rb_tree(&local_138.pools_._M_t);
    std::
    _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_138);
    if (!bVar7) goto LAB_00130690;
    State::State(&local_138);
    iVar8 = g_current_test->assertion_failures_;
    StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&local_138);
    iVar9 = g_current_test->assertion_failures_;
    if (iVar8 == iVar9) {
      AssertParse(&local_138,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                  (ManifestParserOptions)0x0);
      iVar9 = g_current_test->assertion_failures_;
      if (iVar8 != iVar9) goto LAB_00130b8a;
      piVar2 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
      *piVar2 = *piVar2 + 1;
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"in2","");
      local_280._0_8_ = local_280 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"");
      VirtualFileSystem::Create(local_2c8,(string *)local_210,(string *)local_280);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
      }
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      pTVar5 = g_current_test;
      local_280._0_8_ = local_280._0_8_ & 0xffffffffffffff00;
      local_280._8_8_ = (FILE *)0x0;
      local_280._24_8_ = 0;
      local_260._M_local_buf[0] = '\0';
      local_250 = (pointer)0x0;
      ppNStack_248 = (pointer)0x0;
      local_240 = (pointer)0x0;
      ppDStack_238 = (pointer)0x0;
      local_230 = (pointer)0x0;
      ppDStack_228 = (pointer)0x0;
      local_210._0_8_ = local_210 + 0x10;
      local_280._16_8_ = &local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"ninja_deps","");
      LVar10 = DepsLog::Load((DepsLog *)local_280,(string *)local_210,&local_138,&local_2c0);
      bVar7 = testing::Test::Check
                        (pTVar5,LVar10 != LOAD_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x867,"deps_log.Load(\"ninja_deps\", &state, &err)");
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      pTVar5 = g_current_test;
      if (bVar7) {
        local_210._0_8_ = local_210 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"ninja_deps","");
        bVar7 = DepsLog::OpenForWrite((DepsLog *)local_280,(string *)local_210,&local_2c0);
        bVar7 = testing::Test::Check
                          (pTVar5,bVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x868,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
        if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
          operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
        }
        if (bVar7) {
          Builder::Builder((Builder *)local_210,&local_138,local_218,(BuildLog *)0x0,
                           (DepsLog *)local_280,&local_2c8->super_DiskInterface);
          _Var6._M_head_impl = (CommandRunner *)local_190;
          local_190._M_head_impl = &local_220->super_CommandRunner;
          if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
              _Var6._M_head_impl !=
              (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
            (**(code **)(*(long *)_Var6._M_head_impl + 8))();
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                             commands_ran_,
                            (this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                            commands_ran_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          pTVar5 = g_current_test;
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"out","");
          pNVar11 = Builder::AddTarget((Builder *)local_210,&local_2e8,&local_2c0);
          testing::Test::Check
                    (pTVar5,pNVar11 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x86d,"builder.AddTarget(\"out\", &err)");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          pTVar5 = g_current_test;
          iVar8 = std::__cxx11::string::compare((char *)&local_2c0);
          bVar7 = testing::Test::Check
                            (pTVar5,iVar8 == 0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x86e,"\"\" == err");
          pTVar5 = g_current_test;
          if (bVar7) {
            bVar7 = Builder::Build((Builder *)local_210,&local_2c0);
            testing::Test::Check
                      (pTVar5,bVar7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x86f,"builder.Build(&err)");
            pTVar5 = g_current_test;
            iVar8 = std::__cxx11::string::compare((char *)&local_2c0);
            testing::Test::Check
                      (pTVar5,iVar8 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x870,"\"\" == err");
            testing::Test::Check
                      (g_current_test,
                       (long)*(pointer *)
                              ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                      command_runner_.commands_ran_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                       (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                             commands_ran_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x874,"1u == command_runner_.commands_ran_.size()");
            local_190._M_head_impl = (CommandRunner *)0x0;
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
          Builder::~Builder((Builder *)local_210);
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      DepsLog::~DepsLog((DepsLog *)local_280);
    }
    else {
LAB_00130b8a:
      g_current_test->assertion_failures_ = iVar9 + 1;
    }
    if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_0013060b:
    g_current_test->assertion_failures_ = iVar9 + 1;
LAB_00130614:
    if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d6ce0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
  if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_138.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_138);
LAB_00130690:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, Straightforward) {
  string err;
  // Note: in1 was created by the superclass SetUp().
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    fs_.Create("in1.d", "out: in2");
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // The deps file should have been removed.
    EXPECT_EQ(0, fs_.Stat("in1.d", &err));
    // Recreate it for the next step.
    fs_.Create("in1.d", "out: in2");
    deps_log.Close();
    builder.command_runner_.release();
  }

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Touch the file only mentioned in the deps.
    fs_.Tick();
    fs_.Create("in2", "");

    // Run the build again.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    command_runner_.commands_ran_.clear();
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // We should have rebuilt the output due to in2 being
    // out of date.
    EXPECT_EQ(1u, command_runner_.commands_ran_.size());

    builder.command_runner_.release();
  }
}